

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::Unspill(CWriter *this,TypeVector *types)

{
  pointer pTVar1;
  pointer pTVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  StackVar local_40;
  
  pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = (long)pTVar2 - (long)pTVar1;
  lVar5 = (long)uVar4 >> 3;
  if (lVar5 == 1) {
    local_40.index = (int)(uVar4 >> 3) - 1;
    local_40.type.enum_ = Any;
    local_40.type.type_index_ = 0;
    Write(this,&local_40);
    WriteData(this," = tmp;",7);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
  }
  else {
    if (lVar5 == 0) {
      __assert_fail("types.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0xbb5,
                    "void wabt::(anonymous namespace)::CWriter::Unspill(const TypeVector &, const targets &) [targets = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:3012:18)]"
                   );
    }
    if (pTVar2 != pTVar1) {
      uVar6 = 1;
      uVar4 = 0;
      do {
        local_40.index =
             (int)((ulong)((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) + ~(uint)uVar4;
        local_40.type.enum_ = Any;
        local_40.type.type_index_ = 0;
        Write(this,&local_40);
        pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3) <= uVar4) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar4);
        }
        bVar3 = MangleType(pTVar1[uVar4]);
        Writef(this," = tmp.%c%d;",(ulong)bVar3,(ulong)(uVar6 - 1));
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        }
        this->should_write_indent_next_ = true;
        uVar4 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
      } while (uVar4 < (ulong)((long)(types->
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(types->
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                     _M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  return;
}

Assistant:

void CWriter::Unspill(const TypeVector& types) {
  Unspill(types, [&](auto i) { return StackVar(types.size() - i - 1); });
}